

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O1

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set,uint64_t sequence)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  quicly_local_cid_t *pqVar16;
  uint64_t *puVar17;
  
  uVar14 = set->_size;
  uVar13 = 0xffffffffffffffff;
  if (uVar14 != 0) {
    puVar17 = &set->cids[0].sequence;
    uVar15 = 0;
    do {
      uVar13 = uVar15;
      if (*puVar17 == sequence) break;
      uVar15 = uVar15 + 1;
      puVar17 = puVar17 + 7;
      uVar13 = 0xffffffffffffffff;
    } while (uVar14 != uVar15);
  }
  if (uVar13 != 0xffffffffffffffff) {
    if ((uVar13 + 1 < uVar14) && (set->cids[uVar13].state == QUICLY_LOCAL_CID_STATE_PENDING)) {
      pqVar16 = set->cids + uVar13 + 1;
      uVar14 = uVar13;
      do {
        uVar13 = uVar14;
        if (pqVar16->state != QUICLY_LOCAL_CID_STATE_PENDING) break;
        uVar1 = *(undefined8 *)(pqVar16->stateless_reset_token + 0xb);
        uVar2 = *(undefined8 *)pqVar16;
        uVar3 = pqVar16->sequence;
        uVar4 = *(undefined8 *)(pqVar16->cid).cid;
        uVar5 = *(undefined8 *)((pqVar16->cid).cid + 8);
        uVar6 = *(undefined8 *)((pqVar16->cid).cid + 0x10);
        uVar7 = *(undefined8 *)(pqVar16->stateless_reset_token + 3);
        uVar8 = *(undefined8 *)((long)(pqVar16 + -1) + 8);
        uVar9 = *(undefined8 *)((long)(pqVar16 + -1) + 0x10);
        uVar10 = *(undefined8 *)((long)(pqVar16 + -1) + 0x18);
        uVar11 = *(undefined8 *)((long)(pqVar16 + -1) + 0x20);
        uVar12 = *(undefined8 *)((long)(pqVar16 + -1) + 0x28);
        *(undefined8 *)pqVar16 = *(undefined8 *)(pqVar16 + -1);
        pqVar16->sequence = uVar8;
        *(undefined8 *)(pqVar16->cid).cid = uVar9;
        *(undefined8 *)((pqVar16->cid).cid + 8) = uVar10;
        *(undefined8 *)((pqVar16->cid).cid + 0x10) = uVar11;
        *(undefined8 *)(pqVar16->stateless_reset_token + 3) = uVar12;
        *(undefined8 *)(pqVar16->stateless_reset_token + 0xb) =
             *(undefined8 *)((long)(pqVar16 + -1) + 0x30);
        *(undefined8 *)(pqVar16 + -1) = uVar2;
        *(uint64_t *)((long)(pqVar16 + -1) + 8) = uVar3;
        *(undefined8 *)((long)(pqVar16 + -1) + 0x10) = uVar4;
        *(undefined8 *)((long)(pqVar16 + -1) + 0x18) = uVar5;
        *(undefined8 *)((long)(pqVar16 + -1) + 0x20) = uVar6;
        *(undefined8 *)((long)(pqVar16 + -1) + 0x28) = uVar7;
        *(undefined8 *)((long)(pqVar16 + -1) + 0x30) = uVar1;
        uVar13 = uVar14 + 1;
        pqVar16 = pqVar16 + 1;
        uVar15 = uVar14 + 2;
        uVar14 = uVar13;
      } while (uVar15 < set->_size);
    }
    set->cids[uVar13].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
  }
  return;
}

Assistant:

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return;

    do_mark_delivered(set, i);
}